

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O2

void __thiscall ManifestFile::ParseCommon(ManifestFile *this,Value *root_node)

{
  bool bVar1;
  Value *pVVar2;
  Value *pVVar3;
  ValueHolder *this_00;
  const_iterator cVar4;
  ExtensionListing ext_listing;
  Value ext_name;
  Value ext_version;
  value_type local_f0;
  Value *local_c8;
  ValueHolder local_c0;
  undefined1 local_b8;
  String local_98;
  SelfType local_78;
  ValueIteratorBase local_68;
  ValueHolder local_58 [5];
  
  pVVar2 = Json::Value::operator[](root_node,"instance_extensions");
  bVar1 = Json::Value::isNull(pVVar2);
  if ((!bVar1) && (bVar1 = Json::Value::isArray(pVVar2), bVar1)) {
    local_c8 = root_node;
    cVar4 = Json::Value::begin(pVVar2);
    local_68.current_ = cVar4.super_ValueIteratorBase.current_._M_node;
    local_68.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
    cVar4 = Json::Value::end(pVVar2);
    local_78.current_ = cVar4.super_ValueIteratorBase.current_._M_node;
    local_78.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
    while (bVar1 = Json::ValueIteratorBase::operator!=(&local_68,&local_78), root_node = local_c8,
          bVar1) {
      pVVar2 = Json::ValueIteratorBase::deref(&local_68);
      pVVar3 = Json::Value::operator[](pVVar2,"name");
      Json::Value::Value((Value *)&local_c0,pVVar3);
      pVVar2 = Json::Value::operator[](pVVar2,"extension_version");
      Json::Value::Value((Value *)local_58,pVVar2);
      bVar1 = Json::Value::isString((Value *)&local_c0);
      if ((bVar1) &&
         ((bVar1 = Json::Value::isString((Value *)local_58), bVar1 ||
          (bVar1 = Json::Value::isUInt((Value *)local_58), bVar1)))) {
        local_f0.name._M_dataplus._M_p = (pointer)&local_f0.name.field_2;
        local_f0.name._M_string_length = 0;
        local_f0.name.field_2._M_local_buf[0] = '\0';
        local_f0.extension_version = 0;
        Json::Value::asString_abi_cxx11_(&local_98,(Value *)&local_c0);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        bVar1 = Json::Value::isUInt((Value *)local_58);
        if (bVar1) {
          local_f0.extension_version = Json::Value::asUInt((Value *)local_58);
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_98,(Value *)local_58);
          local_f0.extension_version = atoi(local_98._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_98);
        }
        std::vector<ExtensionListing,_std::allocator<ExtensionListing>_>::push_back
                  (&this->_instance_extensions,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
      }
      Json::Value::~Value((Value *)local_58);
      Json::Value::~Value((Value *)&local_c0);
      Json::ValueIteratorBase::increment(&local_68);
    }
  }
  pVVar2 = Json::Value::operator[](root_node,"functions");
  bVar1 = Json::Value::isNull(pVVar2);
  if ((!bVar1) && (bVar1 = Json::Value::empty(pVVar2), !bVar1)) {
    cVar4 = Json::Value::begin(pVVar2);
    local_68.current_ = cVar4.super_ValueIteratorBase.current_._M_node;
    local_68.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
    while( true ) {
      cVar4 = Json::Value::end(pVVar2);
      local_c0.int_ = (LargestInt)cVar4.super_ValueIteratorBase.current_._M_node;
      local_b8 = cVar4.super_ValueIteratorBase.isNull_;
      bVar1 = Json::ValueIteratorBase::operator!=(&local_68,(SelfType *)&local_c0);
      if (!bVar1) break;
      pVVar3 = Json::ValueIteratorBase::deref(&local_68);
      bVar1 = Json::Value::isString(pVVar3);
      if (bVar1) {
        Json::ValueIteratorBase::key((Value *)&local_c0,&local_68);
        Json::Value::asString_abi_cxx11_((String *)local_58,(Value *)&local_c0);
        Json::Value::~Value((Value *)&local_c0);
        pVVar3 = Json::ValueIteratorBase::deref(&local_68);
        Json::Value::asString_abi_cxx11_((String *)&local_c0,pVVar3);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->_functions_renamed,local_58,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0.bool_);
        this_00 = local_58;
      }
      else {
        std::__cxx11::string::string((string *)&local_c0.bool_,"",(allocator *)&local_78);
        std::operator+(&local_f0.name,"ManifestFile::ParseCommon ",&this->_filename);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,&local_f0.name," \"functions\" section contains non-string values.");
        local_98._M_dataplus._M_p = (char *)0x0;
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity = 0;
        LoaderLogger::LogWarningMessage
                  ((string *)&local_c0,(string *)local_58,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_98);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_98);
        std::__cxx11::string::~string((string *)&local_58[0].bool_);
        std::__cxx11::string::~string((string *)&local_f0);
        this_00 = &local_c0;
      }
      std::__cxx11::string::~string((string *)&this_00->bool_);
      Json::ValueIteratorBase::increment(&local_68);
    }
  }
  return;
}

Assistant:

void ManifestFile::ParseCommon(Json::Value const &root_node) {
    const Json::Value &inst_exts = root_node["instance_extensions"];
    if (!inst_exts.isNull() && inst_exts.isArray()) {
        for (const auto &ext : inst_exts) {
            ParseExtension(ext, _instance_extensions);
        }
    }
    const Json::Value &funcs_renamed = root_node["functions"];
    if (!funcs_renamed.isNull() && !funcs_renamed.empty()) {
        for (Json::ValueConstIterator func_it = funcs_renamed.begin(); func_it != funcs_renamed.end(); ++func_it) {
            if (!(*func_it).isString()) {
                LoaderLogger::LogWarningMessage(
                    "", "ManifestFile::ParseCommon " + _filename + " \"functions\" section contains non-string values.");
                continue;
            }
            std::string original_name = func_it.key().asString();
            std::string new_name = (*func_it).asString();
            _functions_renamed.emplace(original_name, new_name);
        }
    }
}